

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

Any __thiscall amrex::MLLinOp::AnyMake(MLLinOp *this,int amrlev,int mglev,IntVect *ng)

{
  long lVar1;
  int ncomp;
  long lVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  IntVect *in_R8;
  long lVar4;
  MFInfo local_240;
  BoxArray local_218;
  MultiFab local_1b0;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,amrlev);
  lVar2 = (long)mglev * 0x18;
  lVar4 = (long)(int)ng;
  convert(&local_218,(BoxArray *)(lVar4 * 0x68 + *(long *)(plVar3[0x16] + lVar2)),
          (IntVect *)(plVar3 + 0xe));
  lVar1 = *(long *)(plVar3[0x19] + lVar2);
  ncomp = (**(code **)(*plVar3 + 0x28))(plVar3);
  local_240.alloc = true;
  local_240._1_7_ = 0;
  local_240.arena = (Arena *)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&local_1b0,&local_218,(DistributionMapping *)(lVar1 + lVar4 * 0x10),ncomp,in_R8
                     ,&local_240,
                     *(FabFactory<amrex::FArrayBox> **)(*(long *)(plVar3[0x1c] + lVar2) + lVar4 * 8)
                    );
  Any::Any<amrex::MultiFab>((Any *)this,&local_1b0);
  MultiFab::~MultiFab(&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray(&local_218);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)this;
}

Assistant:

Any
MLLinOp::AnyMake (int amrlev, int mglev, IntVect const& ng) const
{
    return Any(MultiFab(amrex::convert(m_grids[amrlev][mglev], m_ixtype),
                        m_dmap[amrlev][mglev], getNComp(), ng, MFInfo(),
                        *m_factory[amrlev][mglev]));
}